

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

MapType * __thiscall helics::HandleManager::getMap(HandleManager *this,InterfaceType type)

{
  long lVar1;
  undefined3 in_register_00000031;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000031,type);
  if (iVar2 == 0x66) {
    lVar1 = 0xf8;
  }
  else if (iVar2 == 0x69) {
    lVar1 = 0xc0;
  }
  else {
    lVar1 = 0x88;
    if (iVar2 == 0x70) {
      lVar1 = 0x50;
    }
  }
  return (MapType *)
         ((long)&(this->handles).
                 super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                 ._M_impl.super__Deque_impl_data._M_map + lVar1);
}

Assistant:

const HandleManager::MapType& HandleManager::getMap(InterfaceType type) const
{
    {
        switch (type) {
            case InterfaceType::ENDPOINT:
            case InterfaceType::TRANSLATOR:
            case InterfaceType::SINK:
            default:
                return endpoints;
            case InterfaceType::PUBLICATION:
                return publications;
            case InterfaceType::INPUT:
                return inputs;
            case InterfaceType::FILTER:
                return filters;
        }
    }
}